

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeVertexArrayApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::vertex_attribfv(NegativeTestContext *ctx)

{
  GLfloat local_58 [2];
  float v [4];
  int maxVertexAttribs;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS."
             ,&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  v[2] = (float)NegativeTestContext::getInteger(local_10,0x8869);
  memset(local_58,0,0x10);
  glu::CallLogWrapper::glVertexAttrib1fv(&local_10->super_CallLogWrapper,(GLuint)v[2],local_58);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glVertexAttrib2fv(&local_10->super_CallLogWrapper,(GLuint)v[2],local_58);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glVertexAttrib3fv(&local_10->super_CallLogWrapper,(GLuint)v[2],local_58);
  NegativeTestContext::expectError(local_10,0x501);
  glu::CallLogWrapper::glVertexAttrib4fv(&local_10->super_CallLogWrapper,(GLuint)v[2],local_58);
  NegativeTestContext::expectError(local_10,0x501);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void vertex_attribfv (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater than or equal to GL_MAX_VERTEX_ATTRIBS.");
	int maxVertexAttribs = ctx.getInteger(GL_MAX_VERTEX_ATTRIBS);
	float v[4] = {0.0f};
	ctx.glVertexAttrib1fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib2fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib3fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glVertexAttrib4fv(maxVertexAttribs, &v[0]);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}